

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Matrix_t MatrixMultiply(int num,...)

{
  byte bVar1;
  ulong uVar2;
  char in_AL;
  float *pfVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 uVar4;
  ulong uVar5;
  byte bVar6;
  undefined8 in_RSI;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  undefined8 in_R8;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 in_R9;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 in_XMM0_Da;
  float fVar16;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Matrix_t MVar17;
  va_list argp;
  Matrix_t mat_group [10];
  float *local_1d0;
  uint local_1b8;
  undefined8 local_190;
  float *local_188;
  byte abStack_180 [2];
  undefined6 uStack_17e;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Da;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  puVar10 = (undefined8 *)&stack0x00000008;
  if (0 < num) {
    local_1b8 = 8;
    lVar7 = 0;
    do {
      if (local_1b8 < 0x21) {
        uVar5 = (ulong)local_1b8;
        local_1b8 = local_1b8 + 0x10;
        puVar11 = (undefined8 *)((long)local_e8 + uVar5);
      }
      else {
        puVar11 = puVar10;
        puVar10 = puVar10 + 2;
      }
      uVar4 = puVar11[1];
      *(undefined8 *)((long)&local_188 + lVar7) = *puVar11;
      *(undefined8 *)(abStack_180 + lVar7) = uVar4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)num << 4 != lVar7);
  }
  if (num < 2) {
    puts("ERROR: Martixs not enough!");
    pfVar3 = (float *)0x0;
    uVar4 = 0;
  }
  else {
    local_1d0 = local_188;
    uVar5 = 1;
    bVar6 = abStack_180[1];
    do {
      lVar7 = uVar5 * 0x10;
      local_190 = uVar5;
      if (*(byte *)((long)&local_190 + lVar7 + 1) != abStack_180[lVar7]) {
        puts("ERROR: Martixs sizes don\'t match!");
      }
      bVar1 = abStack_180[lVar7 + 1];
      uVar14 = (ulong)bVar1;
      pfVar3 = (float *)malloc((ulong)abStack_180[0] * 4 * uVar14);
      if (pfVar3 == (float *)0x0) {
        printf("ERROR: Malloc failed!-00");
      }
      uVar2 = local_190;
      if ((ulong)abStack_180[0] != 0) {
        uVar9 = 0;
        pfVar8 = local_1d0;
        do {
          if (bVar1 != 0) {
            lVar7 = 0;
            uVar12 = 0;
            do {
              if (bVar6 == 0) {
                fVar16 = 0.0;
              }
              else {
                pfVar13 = (float *)((long)(&local_188)[uVar5 * 2] + lVar7);
                fVar16 = 0.0;
                uVar15 = 0;
                do {
                  fVar16 = fVar16 + pfVar8[uVar15] * *pfVar13;
                  uVar15 = uVar15 + 1;
                  pfVar13 = (float *)((long)pfVar13 + (ulong)((uint)bVar1 * 4));
                } while (bVar6 != uVar15);
              }
              pfVar3[uVar9 * uVar14 + uVar12] = fVar16;
              uVar12 = uVar12 + 1;
              lVar7 = lVar7 + 4;
            } while (uVar12 != uVar14);
          }
          uVar9 = uVar9 + 1;
          pfVar8 = pfVar8 + bVar6;
        } while (uVar9 != abStack_180[0]);
      }
      if (local_190 != 1) {
        free(local_1d0);
      }
      uVar5 = uVar2 + 1;
      bVar6 = bVar1;
      local_1d0 = pfVar3;
    } while (uVar5 != (uint)num);
    uVar4 = CONCAT62(uStack_17e,CONCAT11(bVar1,abStack_180[0]));
  }
  MVar17.row = (char)uVar4;
  MVar17.column = (char)((ulong)uVar4 >> 8);
  MVar17._10_6_ = (int6)((ulong)uVar4 >> 0x10);
  MVar17.pMatrix = pfVar3;
  return MVar17;
}

Assistant:

Matrix_t MatrixMultiply(int num, ...)
{
	int i;
	float sum = 0;
	uint8_t c, r, k;
	Matrix_t mat_group[MATRIX_MAX_MULTIPLY];
	Matrix_t mat_res;
	Matrix_t mat_temp;
	Matrix_t mat_err = {NULL, 0, 0};

	va_list argp;
	va_start(argp, num);
	for (i = 0; i < num; i++)
	{
		mat_group[i] = va_arg(argp, Matrix_t);
	}
	va_end(argp);

	if (num < 2)
	{
		printf("ERROR: Martixs not enough!\n");
		return mat_err;
	}
	else
	{
		mat_res = mat_group[0];
		for (i = 1; i < num; i++)
		{
			if (mat_group[i - 1].column != mat_group[i].row)
			{
				printf("ERROR: Martixs sizes don't match!\n");
			}
			mat_temp.row = mat_res.row;
			mat_temp.column = mat_group[i].column;
			mat_temp.pMatrix = (float *)malloc(sizeof(float) * mat_temp.row * mat_temp.column); //注意有无内存泄漏
			if (mat_temp.pMatrix == NULL)
				printf("ERROR: Malloc failed!-00");
			for (r = 0; r < mat_res.row; r++)
			{
				for (c = 0; c < mat_group[i].column; c++)
				{
					for (k = 0; k < mat_res.column; k++)
					{
						sum = sum + *(mat_res.pMatrix + mat_res.column * r + k) * *(mat_group[i].pMatrix + k * mat_group[i].column + c);
					}
					*(mat_temp.pMatrix + r * mat_temp.column + c) = sum;
					sum = 0;
				}
			}
			if (i != 1)
				free(mat_res.pMatrix);
			mat_res = mat_temp;
		}
		//Martix_display(mat_temp);
	}
	return mat_res;
}